

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

string * __thiscall
booster::log::sinks::format_plain_text_message_abi_cxx11_
          (string *__return_storage_ptr__,sinks *this,message *msg)

{
  long lVar1;
  time_put *ptVar2;
  size_t sVar3;
  char *pcVar4;
  ostream *poVar5;
  ptime pVar6;
  undefined1 auStack_208 [8];
  locale local_200;
  long local_1f8;
  _Impl local_1f0 [16];
  locale local_1e0;
  ostringstream ss;
  ios_base local_168 [96];
  locale alStack_108 [3];
  long alStack_f0 [18];
  ptime local_60;
  tm formatted;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::locale::classic();
  std::ios::imbue(&local_1e0);
  std::locale::~locale(&local_1e0);
  pVar6 = ptime::now();
  local_60.sec = pVar6.sec;
  local_60.nsec = pVar6.nsec;
  ptime::local_time(&formatted,&local_60);
  std::locale::locale(&local_200,(locale *)((long)&alStack_108[0]._M_impl + *(long *)(_ss + -0x18)))
  ;
  ptVar2 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (&local_200);
  lVar1 = *(long *)((long)alStack_f0 + *(long *)(_ss + -0x18));
  std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
            (ptVar2,lVar1,lVar1 == 0,&ss + *(long *)(_ss + -0x18),0x20,&formatted,
             "%Y-%m-%d %H:%M:%S; ","");
  std::locale::~locale(&local_200);
  pcVar4 = *(char **)(this + 8);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(_ss + -0x18) + 0x30);
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,", ",2);
  pcVar4 = logger::level_to_string(*(level_type *)this);
  sVar3 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,pcVar4,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,": ",2);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ss,(char *)local_200._M_impl,local_1f8);
  if (local_200._M_impl != local_1f0) {
    operator_delete(local_200._M_impl);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," (",2);
  pcVar4 = *(char **)(this + 0x10);
  sVar3 = strlen(pcVar4);
  while ((0x2e < (byte)pcVar4[sVar3] - 0x2f ||
         ((0x600000000801U >> ((ulong)((byte)pcVar4[sVar3] - 0x2f) & 0x3f) & 1) == 0))) {
    if (sVar3 == 0) {
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(_ss + -0x18) + 0x30);
      }
      else {
LAB_001690b1:
        sVar3 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,pcVar4,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&ss,*(int *)(this + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      std::ios_base::~ios_base(local_168);
      return __return_storage_ptr__;
    }
    sVar3 = sVar3 - 1;
  }
  pcVar4 = pcVar4 + sVar3 + 1;
  goto LAB_001690b1;
}

Assistant:

std::string format_plain_text_message(message const &msg)
		{
			std::ostringstream ss;
			ss.imbue(std::locale::classic());
			ptime now = ptime::now();
			std::tm formatted = ptime::local_time(now);
			static char const format[]="%Y-%m-%d %H:%M:%S; ";
			std::use_facet<std::time_put<char> >(ss.getloc()).put(ss,ss,' ',&formatted,format,format+sizeof(format)-1);
			ss << msg.module()<<", " << logger::level_to_string(msg.level()) << ": " << msg.log_message();

			ss <<" (" << msg.file_name() <<":" <<msg.file_line() <<")";
			return ss.str();
		}